

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.h
# Opt level: O2

void __thiscall pbrt::Curve::Curve(Curve *this,SP *material)

{
  __shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  std::__shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_20,&material->super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>);
  Shape::Shape(&this->super_Shape,(SP *)&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  (this->super_Shape).super_Entity._vptr_Entity = (_func_int **)&PTR_toString_abi_cxx11__001688d0;
  math::affine3f::affine3f(&this->transform);
  this->degree = '\x03';
  (this->P).super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->P).super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->P).super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->width0 = 1.0;
  this->width1 = 1.0;
  return;
}

Assistant:

Curve(Material::SP material=Material::SP()) : Shape(material) {}